

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_insve_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t n)

{
  long lVar1;
  fpr_t *pfVar2;
  
  if (df < 4) {
    lVar1 = (ulong)wd * 0x10 + 0x338;
    pfVar2 = (env->active_fpu).fpr + ws;
    switch(df) {
    case 0:
      *(undefined1 *)((long)(env->active_fpu).fpr + (ulong)n + lVar1 + -0x338) =
           *(undefined1 *)pfVar2;
      return;
    case 1:
      *(undefined2 *)((long)(env->active_fpu).fpr + (ulong)n * 2 + lVar1 + -0x338) =
           *(undefined2 *)pfVar2;
      return;
    case 2:
      *(float32 *)((long)(env->active_fpu).fpr + (ulong)n * 4 + lVar1 + -0x338) = pfVar2->fs[0];
      return;
    case 3:
      *(float64 *)((long)(env->active_fpu).fpr + (ulong)n * 8 + lVar1 + -0x338) = pfVar2->fd;
      return;
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                ,0x14d6,
                "void helper_msa_insve_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

void helper_msa_insve_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                         uint32_t ws, uint32_t n)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    switch (df) {
    case DF_BYTE:
        pwd->b[n] = (int8_t)pws->b[0];
        break;
    case DF_HALF:
        pwd->h[n] = (int16_t)pws->h[0];
        break;
    case DF_WORD:
        pwd->w[n] = (int32_t)pws->w[0];
        break;
    case DF_DOUBLE:
        pwd->d[n] = (int64_t)pws->d[0];
        break;
    default:
        assert(0);
    }
}